

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::ConfidentialTransaction::GetByteData
          (ByteData *__return_storage_ptr__,ConfidentialTransaction *this,bool has_witness)

{
  wally_tx_output *pwVar1;
  wally_tx_witness_stack *pwVar2;
  uchar *puVar3;
  wally_tx_witness_item *pwVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  ulong uVar11;
  CfdException *pCVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  ulong uVar14;
  ulong uVar15;
  uint32_t flags;
  uint uVar16;
  size_t max_size;
  ulong uVar17;
  size_t sVar18;
  size_t *psVar19;
  byte bVar20;
  uint8_t *result_1;
  undefined8 *puVar21;
  uint8_t *puVar22;
  uint8_t *result;
  undefined1 *puVar23;
  wally_tx *tx;
  byte bVar24;
  wally_tx_input *pwVar25;
  int ret;
  size_t txsize;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ulong local_a8;
  int local_a0;
  bool local_99;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78;
  pointer local_70;
  size_t *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  uint local_44;
  wally_tx *local_40;
  ByteData *local_38;
  
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_70 = (pointer)0x0;
  flags = (uint32_t)CONCAT71(in_register_00000011,has_witness);
  local_99 = has_witness;
  local_a0 = wally_tx_get_length(tx,flags,(size_t *)&local_70);
  if (local_a0 != 0) {
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xd98;
    local_88._M_allocated_capacity = 0x59f44f;
    logger::log<int&,bool&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
               "wally_tx_get_length NG[{}]. wit[{}]",&local_a0,&local_99);
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"tx length calc error.","")
    ;
    CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)local_98);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a0 = 0;
  if (local_70 < &DAT_0000000b) {
    local_a0 = -2;
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xd9f;
    local_88._M_allocated_capacity = 0x59f44f;
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"tx size low.[{}]",
               (unsigned_long *)&local_70);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,(size_type)local_70,(allocator_type *)local_98);
  if (local_a0 != -2) {
    local_98._0_8_ = local_70;
    local_a0 = wally_tx_to_bytes(tx,flags,local_60.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,(size_t *)local_98)
    ;
  }
  if (local_a0 != 0) {
    if (local_a0 != -2) {
      local_98._0_8_ = "cfdcore_elements_transaction.cpp";
      local_98._8_4_ = 0xe89;
      local_88._M_allocated_capacity = 0x59f44f;
      logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                        "wally_tx_to_bytes NG[{}].",&local_a0);
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_98._0_8_ = &local_88;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"tx hex convert error.","");
      CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)local_98);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_68 = &tx->num_inputs;
    if ((tx->num_inputs != 0) && (tx->num_outputs != 0)) {
      local_98._0_8_ = "cfdcore_elements_transaction.cpp";
      local_98._8_4_ = 0xe84;
      local_88._M_allocated_capacity = 0x59f44f;
      logger::log<int&,unsigned_long&,unsigned_long&>
                ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                 "wally_tx_to_bytes NG[{}]. in/out={}/{}",&local_a0,local_68,&tx->num_outputs);
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_98._0_8_ = &local_88;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"tx hex convert error.","");
      CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)local_98);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xdaf;
    local_88._M_allocated_capacity = 0x59f44f;
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"wally_tx_get_length size[{}]",
               (unsigned_long *)&local_70);
    local_a8 = tx->num_inputs * 0xd0 + tx->num_outputs * 0x70 + 0x38;
    if (tx->num_inputs != 0) {
      pwVar25 = tx->inputs;
      uVar13 = 1;
      uVar11 = 0;
      do {
        uVar14 = local_a8 + 0x40;
        if (pwVar25[uVar11].issuance_amount != (uchar *)0x0) {
          uVar14 = pwVar25[uVar11].issuance_amount_len + local_a8 + 0x4a;
        }
        local_a8 = uVar14;
        if (pwVar25[uVar11].inflation_keys != (uchar *)0x0) {
          local_a8 = uVar14 + pwVar25[uVar11].inflation_keys_len + 10;
        }
        uVar11 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar11 < *local_68);
    }
    if (tx->num_outputs != 0) {
      pwVar1 = tx->outputs;
      uVar11 = 1;
      uVar14 = 0;
      do {
        uVar15 = uVar11;
        if (pwVar1[uVar14].asset != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].asset_len + 10;
        }
        if (pwVar1[uVar14].value != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].value_len + 10;
        }
        if (pwVar1[uVar14].nonce != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].nonce_len + 10;
        }
        if (pwVar1[uVar14].script != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].script_len + 10;
        }
        local_a8 = local_a8 + 10;
        uVar11 = (ulong)((int)uVar15 + 1);
        uVar14 = uVar15;
      } while (uVar15 < tx->num_outputs);
    }
    uVar11 = 0;
    if (*local_68 == 0) {
      bVar20 = 0;
    }
    else {
      pwVar25 = tx->inputs;
      bVar20 = 0;
      uVar14 = 0;
      do {
        if (pwVar25[uVar11].issuance_amount_rangeproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar25[uVar11].issuance_amount_rangeproof_len + 10;
          uVar14 = 1;
        }
        if (pwVar25[uVar11].inflation_keys_rangeproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar25[uVar11].inflation_keys_rangeproof_len + 10;
          uVar14 = 1;
        }
        pwVar2 = pwVar25[uVar11].witness;
        if (pwVar2 == (wally_tx_witness_stack *)0x0) {
          sVar18 = 0;
        }
        else {
          sVar18 = pwVar2->num_items;
        }
        if (sVar18 != 0) {
          psVar19 = &pwVar2->items->witness_len;
          uVar13 = 1;
          do {
            local_a8 = local_a8 + *psVar19 + 10;
            uVar15 = (ulong)uVar13;
            psVar19 = psVar19 + 2;
            uVar13 = uVar13 + 1;
          } while (uVar15 < sVar18);
          bVar20 = 1;
        }
        pwVar2 = pwVar25[uVar11].pegin_witness;
        if (pwVar2 == (wally_tx_witness_stack *)0x0) {
          sVar18 = 0;
        }
        else {
          sVar18 = pwVar2->num_items;
        }
        if (sVar18 != 0) {
          psVar19 = &pwVar2->items->witness_len;
          uVar13 = 1;
          do {
            local_a8 = local_a8 + *psVar19 + 10;
            uVar15 = (ulong)uVar13;
            psVar19 = psVar19 + 2;
            uVar13 = uVar13 + 1;
          } while (uVar15 < sVar18);
          bVar20 = 1;
        }
        local_a8 = local_a8 + 10;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < *local_68);
      bVar20 = bVar20 | (byte)uVar14;
      uVar11 = uVar14;
    }
    if (tx->num_outputs == 0) {
      bVar24 = 0;
    }
    else {
      pwVar1 = tx->outputs;
      uVar13 = 1;
      uVar14 = 0;
      bVar24 = 0;
      do {
        if (pwVar1[uVar14].surjectionproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].surjectionproof_len + 10;
          bVar24 = 1;
        }
        if (pwVar1[uVar14].rangeproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].rangeproof_len + 10;
          bVar24 = 1;
        }
        local_a8 = local_a8 + 10;
        uVar14 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 < tx->num_outputs);
    }
    local_38 = __return_storage_ptr__;
    if ((ulong)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < local_a8) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_60,local_a8);
      local_98._0_8_ = "cfdcore_elements_transaction.cpp";
      local_98._8_4_ = 0xdf8;
      local_88._M_allocated_capacity = 0x59f44f;
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"buffer.resize[{}]",&local_a8);
    }
    *(uint32_t *)
     local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = tx->version;
    uVar13 = 1;
    if (bVar20 == 0) {
      uVar13 = (uint)bVar24;
    }
    uVar16 = 0;
    if ((tx->version >> 0x1e & 1) == 0) {
      uVar16 = uVar13;
    }
    *(char *)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 4) = (char)uVar16;
    puVar9 = (uint32_t *)
             AbstractTransaction::CopyVariableInt
                       (tx->num_inputs,
                        (uint8_t *)
                        ((long)local_60.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + 5));
    local_44 = uVar16;
    if (*local_68 != 0) {
      uVar14 = 0;
      uVar15 = 1;
      local_40 = tx;
      do {
        pwVar25 = tx->inputs;
        uVar13 = pwVar25[uVar14].index;
        if ((pwVar25[uVar14].pegin_witness != (wally_tx_witness_stack *)0x0) &&
           ((pwVar25[uVar14].pegin_witness)->num_items != 0)) {
          uVar13 = uVar13 | 0x40000000;
        }
        pwVar25 = pwVar25 + uVar14;
        if ((pwVar25->issuance_amount != (uchar *)0x0) && (pwVar25->issuance_amount_len != 0)) {
          uVar13 = uVar13 | 0x80000000;
        }
        uVar6 = *(undefined8 *)pwVar25->txhash;
        uVar7 = *(undefined8 *)(pwVar25->txhash + 8);
        uVar8 = *(undefined8 *)(pwVar25->txhash + 0x18);
        *(undefined8 *)(puVar9 + 4) = *(undefined8 *)(pwVar25->txhash + 0x10);
        *(undefined8 *)(puVar9 + 6) = uVar8;
        *(undefined8 *)puVar9 = uVar6;
        *(undefined8 *)(puVar9 + 2) = uVar7;
        puVar9[8] = uVar13;
        puVar10 = (uint32_t *)
                  AbstractTransaction::CopyVariableBuffer
                            (pwVar25->script,pwVar25->script_len,(uint8_t *)(puVar9 + 9));
        *puVar10 = pwVar25->sequence;
        puVar9 = puVar10 + 1;
        psVar19 = local_68;
        if (uVar11 != 0) {
          uVar6 = *(undefined8 *)pwVar25->blinding_nonce;
          uVar7 = *(undefined8 *)(pwVar25->blinding_nonce + 8);
          uVar8 = *(undefined8 *)(pwVar25->blinding_nonce + 0x18);
          *(undefined8 *)(puVar10 + 5) = *(undefined8 *)(pwVar25->blinding_nonce + 0x10);
          *(undefined8 *)(puVar10 + 7) = uVar8;
          *(undefined8 *)puVar9 = uVar6;
          *(undefined8 *)(puVar10 + 3) = uVar7;
          uVar6 = *(undefined8 *)pwVar25->entropy;
          uVar7 = *(undefined8 *)(pwVar25->entropy + 8);
          uVar8 = *(undefined8 *)(pwVar25->entropy + 0x18);
          *(undefined8 *)(puVar10 + 0xd) = *(undefined8 *)(pwVar25->entropy + 0x10);
          *(undefined8 *)(puVar10 + 0xf) = uVar8;
          *(undefined8 *)(puVar10 + 9) = uVar6;
          *(undefined8 *)(puVar10 + 0xb) = uVar7;
          puVar3 = pwVar25->issuance_amount;
          uVar14 = pwVar25->issuance_amount_len;
          if (uVar14 == 0 || puVar3 == (uchar *)0x0) {
LAB_0048d622:
            *(undefined1 *)(puVar10 + 0x11) = 0;
            puVar23 = (undefined1 *)((long)puVar10 + 0x45);
          }
          else {
            if (*puVar3 == '\x01') {
              uVar17 = 9;
            }
            else {
              uVar17 = 0x21;
              if (*puVar3 == '\0') goto LAB_0048d622;
            }
            if (uVar17 < uVar14) {
              uVar14 = uVar17;
            }
            local_88._M_allocated_capacity = 0;
            local_88._8_8_ = 0;
            local_98._0_8_ = (pointer)0x0;
            local_98._8_8_ = 0;
            local_78 = 0;
            memcpy(local_98,puVar3,uVar14);
            tx = local_40;
            memcpy(puVar10 + 0x11,local_98,uVar17);
            puVar23 = (undefined1 *)((long)(puVar10 + 0x11) + uVar17);
          }
          psVar19 = local_68;
          puVar3 = pwVar25->inflation_keys;
          uVar14 = pwVar25->inflation_keys_len;
          if (uVar14 == 0 || puVar3 == (uchar *)0x0) {
LAB_0048d6b0:
            *puVar23 = 0;
            puVar9 = (uint32_t *)(puVar23 + 1);
          }
          else {
            if (*puVar3 == '\x01') {
              uVar17 = 9;
            }
            else {
              uVar17 = 0x21;
              if (*puVar3 == '\0') goto LAB_0048d6b0;
            }
            if (uVar17 < uVar14) {
              uVar14 = uVar17;
            }
            local_88._M_allocated_capacity = 0;
            local_88._8_8_ = 0;
            local_98._0_8_ = (pointer)0x0;
            local_98._8_8_ = 0;
            local_78 = 0;
            memcpy(local_98,puVar3,uVar14);
            tx = local_40;
            memcpy(puVar23,local_98,uVar17);
            puVar9 = (uint32_t *)(puVar23 + uVar17);
          }
        }
        bVar5 = uVar15 < *psVar19;
        uVar14 = uVar15;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (bVar5);
    }
    puVar9 = (uint32_t *)AbstractTransaction::CopyVariableInt(tx->num_outputs,(uint8_t *)puVar9);
    if (tx->num_outputs != 0) {
      uVar11 = 0;
      uVar14 = 1;
      do {
        pwVar1 = tx->outputs;
        puVar3 = pwVar1[uVar11].asset;
        uVar15 = pwVar1[uVar11].asset_len;
        if ((uVar15 == 0 || puVar3 == (uchar *)0x0) || (*puVar3 == '\0')) {
          *(undefined1 *)puVar9 = 0;
          puVar23 = (undefined1 *)((long)puVar9 + 1);
        }
        else {
          if (0x20 < uVar15) {
            uVar15 = 0x21;
          }
          local_88._M_allocated_capacity = 0;
          local_88._8_8_ = 0;
          local_98._0_8_ = (pointer)0x0;
          local_98._8_8_ = 0;
          local_78 = 0;
          memcpy(local_98,puVar3,uVar15);
          *(undefined8 *)puVar9 = local_98._0_8_;
          *(undefined8 *)(puVar9 + 2) = local_98._8_8_;
          *(size_type *)(puVar9 + 4) = local_88._M_allocated_capacity;
          *(undefined8 *)(puVar9 + 6) = local_88._8_8_;
          *(undefined1 *)(puVar9 + 8) = local_78;
          puVar23 = (undefined1 *)((long)puVar9 + 0x21);
        }
        puVar3 = pwVar1[uVar11].value;
        uVar15 = pwVar1[uVar11].value_len;
        if (uVar15 == 0 || puVar3 == (uchar *)0x0) {
LAB_0048d7d9:
          *puVar23 = 0;
          puVar21 = (undefined8 *)(puVar23 + 1);
        }
        else {
          if (*puVar3 == '\x01') {
            uVar17 = 9;
          }
          else {
            uVar17 = 0x21;
            if (*puVar3 == '\0') goto LAB_0048d7d9;
          }
          if (uVar17 < uVar15) {
            uVar15 = uVar17;
          }
          local_88._M_allocated_capacity = 0;
          local_88._8_8_ = 0;
          local_98._0_8_ = (pointer)0x0;
          local_98._8_8_ = 0;
          local_78 = 0;
          memcpy(local_98,puVar3,uVar15);
          memcpy(puVar23,local_98,uVar17);
          puVar21 = (undefined8 *)(puVar23 + uVar17);
        }
        puVar3 = pwVar1[uVar11].nonce;
        uVar15 = pwVar1[uVar11].nonce_len;
        if ((uVar15 == 0 || puVar3 == (uchar *)0x0) || (*puVar3 == '\0')) {
          *(undefined1 *)puVar21 = 0;
          puVar22 = (uint8_t *)((long)puVar21 + 1);
        }
        else {
          if (0x20 < uVar15) {
            uVar15 = 0x21;
          }
          local_88._M_allocated_capacity = 0;
          local_88._8_8_ = 0;
          local_98._0_8_ = (pointer)0x0;
          local_98._8_8_ = 0;
          local_78 = 0;
          memcpy(local_98,puVar3,uVar15);
          *puVar21 = local_98._0_8_;
          puVar21[1] = local_98._8_8_;
          puVar21[2] = local_88._M_allocated_capacity;
          puVar21[3] = local_88._8_8_;
          *(undefined1 *)(puVar21 + 4) = local_78;
          puVar22 = (uint8_t *)((long)puVar21 + 0x21);
        }
        puVar9 = (uint32_t *)
                 AbstractTransaction::CopyVariableBuffer
                           (pwVar1[uVar11].script,pwVar1[uVar11].script_len,puVar22);
        bVar5 = uVar14 < tx->num_outputs;
        uVar11 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar5);
    }
    *puVar9 = tx->locktime;
    puVar9 = puVar9 + 1;
    if ((char)local_44 != '\0') {
      if (*local_68 != 0) {
        uVar11 = 0;
        do {
          pwVar25 = tx->inputs;
          puVar22 = AbstractTransaction::CopyVariableBuffer
                              (pwVar25[uVar11].issuance_amount_rangeproof,
                               pwVar25[uVar11].issuance_amount_rangeproof_len,(uint8_t *)puVar9);
          puVar22 = AbstractTransaction::CopyVariableBuffer
                              (pwVar25[uVar11].inflation_keys_rangeproof,
                               pwVar25[uVar11].inflation_keys_rangeproof_len,puVar22);
          if (pwVar25[uVar11].witness == (wally_tx_witness_stack *)0x0) {
            sVar18 = 0;
          }
          else {
            sVar18 = (pwVar25[uVar11].witness)->num_items;
          }
          puVar22 = AbstractTransaction::CopyVariableInt(sVar18,puVar22);
          if (sVar18 != 0) {
            uVar14 = 0;
            uVar15 = 1;
            do {
              pwVar4 = (pwVar25[uVar11].witness)->items;
              puVar22 = AbstractTransaction::CopyVariableBuffer
                                  (pwVar4[uVar14].witness,pwVar4[uVar14].witness_len,puVar22);
              bVar5 = uVar15 < sVar18;
              uVar14 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar5);
          }
          if (pwVar25[uVar11].pegin_witness == (wally_tx_witness_stack *)0x0) {
            sVar18 = 0;
          }
          else {
            sVar18 = (pwVar25[uVar11].pegin_witness)->num_items;
          }
          puVar9 = (uint32_t *)AbstractTransaction::CopyVariableInt(sVar18,puVar22);
          if (sVar18 != 0) {
            uVar14 = 0;
            uVar15 = 1;
            do {
              pwVar4 = (pwVar25[uVar11].pegin_witness)->items;
              puVar9 = (uint32_t *)
                       AbstractTransaction::CopyVariableBuffer
                                 (pwVar4[uVar14].witness,pwVar4[uVar14].witness_len,
                                  (uint8_t *)puVar9);
              bVar5 = uVar15 < sVar18;
              uVar14 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar5);
          }
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (uVar11 < *local_68);
      }
      if (tx->num_outputs != 0) {
        uVar11 = 0;
        uVar14 = 1;
        do {
          pwVar1 = tx->outputs;
          puVar22 = AbstractTransaction::CopyVariableBuffer
                              (pwVar1[uVar11].surjectionproof,pwVar1[uVar11].surjectionproof_len,
                               (uint8_t *)puVar9);
          puVar9 = (uint32_t *)
                   AbstractTransaction::CopyVariableBuffer
                             (pwVar1[uVar11].rangeproof,pwVar1[uVar11].rangeproof_len,puVar22);
          bVar5 = uVar14 < tx->num_outputs;
          uVar11 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar5);
      }
    }
    __return_storage_ptr__ = local_38;
    local_70 = (pointer)((long)puVar9 -
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (local_70 <
        local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
        -(long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_60,(size_type)local_70);
      local_98._0_8_ = "cfdcore_elements_transaction.cpp";
      local_98._8_4_ = 0xe80;
      local_88._M_allocated_capacity = 0x59f44f;
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"set buffer size[{}]",
                 (unsigned_long *)&local_70);
    }
  }
  ByteData::ByteData(__return_storage_ptr__,&local_60);
  if ((uint32_t *)
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransaction::GetByteData(bool has_witness) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t size = 0;
  uint32_t flag = 0;
  if (has_witness) {
    flag = WALLY_TX_FLAG_USE_WITNESS;
  }

  int ret = wally_tx_get_length(tx_pointer, flag, &size);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]. wit[{}]", ret,
        has_witness);
    throw CfdException(kCfdIllegalStateError, "tx length calc error.");
  }
  // info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
  if (size < kElementsTransactionMinimumSize) {
    ret = WALLY_EINVAL;
    warn(CFD_LOG_SOURCE, "tx size low.[{}]", size);
  }
  std::vector<uint8_t> buffer(size);
  if (ret != WALLY_EINVAL) {
    size_t txsize = size;
    // flag |= WALLY_TX_FLAG_USE_ELEMENTS;
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &txsize);
  }
  if (ret == WALLY_EINVAL) {
    /* About conversion with object.
     * In libwally, txin / txout does not allow empty data.
     * Therefore, if txin / txout is empty, object to byte is an error.
     * Therefore, it performs its own processing under certain circumstances.
     */
    if ((tx_pointer->num_inputs == 0) || (tx_pointer->num_outputs == 0)) {
      info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
      bool has_txin_witness = false;
      bool has_txin_rangeproof = false;
      bool has_txout_witness = false;
      bool is_witness = false;
      // Necessary size calculation because wally_tx_get_length may be
      // an invalid value (reserved more)
      size_t need_size = sizeof(struct wally_tx);
      need_size += tx_pointer->num_inputs * sizeof(struct wally_tx_input);
      need_size += tx_pointer->num_outputs * sizeof(struct wally_tx_output);
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        need_size += sizeof(input->blinding_nonce);
        need_size += sizeof(input->entropy);
        if (input->issuance_amount) {
          need_size += input->issuance_amount_len + 10;
        }
        if (input->inflation_keys) {
          need_size += input->inflation_keys_len + 10;
        }
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->asset) need_size += output->asset_len + 10;
        if (output->value) need_size += output->value_len + 10;
        if (output->nonce) need_size += output->nonce_len + 10;
        if (output->script) need_size += output->script_len + 10;
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        // issuance amount range proof
        if (input->issuance_amount_rangeproof) {
          need_size += input->issuance_amount_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // inflation keys range proof
        if (input->inflation_keys_rangeproof) {
          need_size += input->inflation_keys_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // witness
        size_t num_items = input->witness ? input->witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        // pegin_witness
        num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->pegin_witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->surjectionproof) {
          need_size += output->surjectionproof_len + 10;
          has_txout_witness = true;
        }
        if (output->rangeproof) {
          need_size += output->rangeproof_len + 10;
          has_txout_witness = true;
        }
        need_size += 10;
      }
      if (need_size > buffer.size()) {
        buffer.resize(need_size);
        info(CFD_LOG_SOURCE, "buffer.resize[{}]", need_size);
      }

      uint8_t *address_pointer = buffer.data();
      memcpy(
          address_pointer, &tx_pointer->version, sizeof(tx_pointer->version));
      address_pointer += sizeof(tx_pointer->version);
      uint8_t witness_flag = 0;
      if ((tx_pointer->version & kTransactionVersionNoWitness) == 0) {
        if (has_txin_witness || has_txin_rangeproof || has_txout_witness) {
          is_witness = true;
          witness_flag = 1;
        }
      }
      *address_pointer = witness_flag;
      ++address_pointer;

      // txin
      address_pointer =
          CopyVariableInt(tx_pointer->num_inputs, address_pointer);
      uint32_t temp_index;
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        temp_index = input->index;
        if (input->pegin_witness && (input->pegin_witness->num_items > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_PEGIN_FLAG);
        }
        if (input->issuance_amount && (input->issuance_amount_len > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_ISSUANCE_FLAG);
        }
        memcpy(address_pointer, input->txhash, sizeof(input->txhash));
        address_pointer += sizeof(input->txhash);
        memcpy(address_pointer, &temp_index, sizeof(temp_index));
        address_pointer += sizeof(temp_index);
        address_pointer = CopyVariableBuffer(
            input->script, input->script_len, address_pointer);
        memcpy(address_pointer, &input->sequence, sizeof(input->sequence));
        address_pointer += sizeof(input->sequence);
        if (has_txin_rangeproof) {
          // blinding_nonce
          memcpy(
              address_pointer, &input->blinding_nonce,
              sizeof(input->blinding_nonce));
          address_pointer += sizeof(input->blinding_nonce);
          // entropy
          memcpy(address_pointer, &input->entropy, sizeof(input->entropy));
          address_pointer += sizeof(input->entropy);
          // issuance amount
          address_pointer = CopyConfidentialCommitment(
              input->issuance_amount, input->issuance_amount_len,
              kConfidentialValueSize, address_pointer);
          // inflation keys
          address_pointer = CopyConfidentialCommitment(
              input->inflation_keys, input->inflation_keys_len,
              kConfidentialValueSize, address_pointer);
        }
      }

      // txout
      address_pointer =
          CopyVariableInt(tx_pointer->num_outputs, address_pointer);
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        // asset (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->asset, output->asset_len, kConfidentialDataSize,
            address_pointer);
        // value (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->value, output->value_len, kConfidentialValueSize,
            address_pointer);
        // nonce (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->nonce, output->nonce_len, kConfidentialDataSize,
            address_pointer);
        // script
        address_pointer = CopyVariableBuffer(
            output->script, output->script_len, address_pointer);
      }

      // locktime
      memcpy(
          address_pointer, &tx_pointer->locktime,
          sizeof(tx_pointer->locktime));
      address_pointer += sizeof(tx_pointer->locktime);

      // witness
      if (is_witness) {
        for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
          const struct wally_tx_input *input = tx_pointer->inputs + i;
          // issuance amount range proof
          address_pointer = CopyVariableBuffer(
              input->issuance_amount_rangeproof,
              input->issuance_amount_rangeproof_len, address_pointer);
          // inflation keys range proof
          address_pointer = CopyVariableBuffer(
              input->inflation_keys_rangeproof,
              input->inflation_keys_rangeproof_len, address_pointer);
          // witness
          size_t num_items = input->witness ? input->witness->num_items : 0;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
          // pegin_witness
          num_items = 0;
          if (input->pegin_witness)
            num_items = input->pegin_witness->num_items;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->pegin_witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
        }

        for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
          const struct wally_tx_output *output = tx_pointer->outputs + i;
          // surjection proof
          address_pointer = CopyVariableBuffer(
              output->surjectionproof, output->surjectionproof_len,
              address_pointer);
          // range proof
          address_pointer = CopyVariableBuffer(
              output->rangeproof, output->rangeproof_len, address_pointer);
        }
      }

      unsigned char *start_address = buffer.data();
      size = address_pointer - start_address;
      if (buffer.size() > size) {
        buffer.resize(size);
        info(CFD_LOG_SOURCE, "set buffer size[{}]", size);
      }
    } else {
      warn(
          CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}]. in/out={}/{}", ret,
          tx_pointer->num_inputs, tx_pointer->num_outputs);
      throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
    }
  } else if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
  }

  return ByteData(buffer);
}